

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O2

size_t absl::lts_20250127::container_internal::PrepareInsertAfterSoo
                 (size_t hash,size_t slot_size,CommonFields *common)

{
  ulong uVar1;
  GrowthInfo *this;
  
  if (common->capacity_ == 3) {
    CommonFields::increment_size(common);
    uVar1 = (ulong)(common->heap_or_soo_).heap.control ^ hash;
    uVar1 = uVar1 - (uVar1 >> 1 & 0x5555555555555555);
    uVar1 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
    uVar1 = (ulong)((byte)(((uVar1 >> 4) + uVar1 & 0x30f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) &
                   2);
    this = CommonFields::growth_info(common);
    GrowthInfo::OverwriteEmptyAsFull(this);
    SetCtrlInSingleGroupTable(common,uVar1,(ctrl_t)hash & ~kEmpty,slot_size);
    CommonFields::infoz(common);
    return uVar1;
  }
  __assert_fail("common.capacity() == NextCapacity(SooCapacity())",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                ,0x91,
                "size_t absl::container_internal::PrepareInsertAfterSoo(size_t, size_t, CommonFields &)"
               );
}

Assistant:

size_t PrepareInsertAfterSoo(size_t hash, size_t slot_size,
                             CommonFields& common) {
  assert(common.capacity() == NextCapacity(SooCapacity()));
  // After resize from capacity 1 to 3, we always have exactly the slot with
  // index 1 occupied, so we need to insert either at index 0 or index 2.
  assert(HashSetResizeHelper::SooSlotIndex() == 1);
  PrepareInsertCommon(common);
  const size_t offset = SingleGroupTableH1(hash, common.control()) & 2;
  common.growth_info().OverwriteEmptyAsFull();
  SetCtrlInSingleGroupTable(common, offset, H2(hash), slot_size);
  common.infoz().RecordInsert(hash, /*distance_from_desired=*/0);
  return offset;
}